

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O2

int32_t __thiscall
icu_63::HebrewCalendar::handleGetMonthLength
          (HebrewCalendar *this,int32_t extendedYear,int32_t month)

{
  int iVar1;
  uint uVar2;
  int8_t (*paiVar3) [3];
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  uVar4 = (ulong)(uint)month;
  iVar7 = extendedYear * 0xc + 0x11;
  while( true ) {
    if (-1 < (int)uVar4) break;
    extendedYear = extendedYear + -1;
    iVar7 = iVar7 + -0xc;
    iVar1 = 0xc;
    if (iVar7 % 0x13 < 0) {
      iVar1 = -7;
    }
    uVar4 = (ulong)((int)uVar4 + (iVar7 % 0x13 < iVar1 ^ 0xd));
  }
  while (uVar2 = (uint)uVar4, 0xc < uVar2) {
    extendedYear = extendedYear + 1;
    iVar6 = iVar7 % 0x13;
    iVar1 = 0xc;
    if (iVar6 < 0) {
      iVar1 = -7;
    }
    iVar7 = iVar7 + 0xc;
    uVar4 = (ulong)((uVar2 + (iVar6 < iVar1)) - 0xd);
  }
  if (uVar2 - 1 < 2) {
    uVar2 = yearType(this,extendedYear);
    uVar5 = (ulong)uVar2;
    paiVar3 = MONTH_LENGTH + uVar4;
  }
  else {
    uVar5 = uVar4 * 3;
    paiVar3 = MONTH_LENGTH;
  }
  return (int)(*paiVar3)[uVar5];
}

Assistant:

int32_t HebrewCalendar::handleGetMonthLength(int32_t extendedYear, int32_t month) const {
    // Resolve out-of-range months.  This is necessary in order to
    // obtain the correct year.  We correct to
    // a 12- or 13-month year (add/subtract 12 or 13, depending
    // on the year) but since we _always_ number from 0..12, and
    // the leap year determines whether or not month 5 (Adar 1)
    // is present, we allow 0..12 in any given year.
    while (month < 0) {
        month += monthsInYear(--extendedYear);
    }
    // Careful: allow 0..12 in all years
    while (month > 12) {
        month -= monthsInYear(extendedYear++);
    }

    switch (month) {
    case HESHVAN:
    case KISLEV:
      // These two month lengths can vary
      return MONTH_LENGTH[month][yearType(extendedYear)];

    default:
      // The rest are a fixed length
      return MONTH_LENGTH[month][0];
    }
}